

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O1

tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> __thiscall
pfederc::optimize(pfederc *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr
                 ,size_t *reducedexpressions)

{
  _Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> _Var1;
  undefined *puVar2;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var3;
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> tVar4;
  
  _Var1.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (_Head_base<0UL,_pfederc::Expr_*,_false>)
       (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  switch(*(ExprType *)
          ((long)_Var1.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 0x18)) {
  case EXPR_PROG:
    puVar2 = &ProgramExpr::vtable;
    break;
  case EXPR_FUNC:
    puVar2 = &FuncExpr::vtable;
    break;
  default:
    *this = (pfederc)0x0;
    *(_Head_base<0UL,_pfederc::Expr_*,_false> *)(this + 8) =
         _Var1.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    goto LAB_0010e60b;
  case EXPR_LAMBDA:
    puVar2 = &LambdaExpr::vtable;
    break;
  case EXPR_CLASS:
    puVar2 = &ClassExpr::vtable;
    break;
  case EXPR_TRAITIMPL:
    puVar2 = &TraitImplExpr::vtable;
    break;
  case EXPR_MOD:
    puVar2 = &ModExpr::vtable;
    break;
  case EXPR_SAFE:
    puVar2 = &SafeExpr::vtable;
    break;
  case EXPR_IF:
    puVar2 = &IfExpr::vtable;
    break;
  case EXPR_LOOP_FOR:
  case EXPR_LOOP_DO:
    puVar2 = &LoopExpr::vtable;
    break;
  case EXPR_MATCH:
    puVar2 = &MatchExpr::vtable;
    break;
  case EXPR_BIOP:
    _Var3._M_head_impl = &((BiOpExpr *)0x0)->super_Expr;
    if (*(_func_int ***)_Var1.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl ==
        (_func_int **)&PTR__BiOpExpr_0012b998) {
      _Var3._M_head_impl = (Expr *)_Var1.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    }
    tVar4 = optimizeBiOpExpr(this,(BiOpExpr *)_Var3._M_head_impl,reducedexpressions);
    reducedexpressions =
         (size_t *)
         tVar4.
         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
         .
         super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
         ._M_head_impl._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    goto LAB_0010e60b;
  case EXPR_UNOP:
    _Var3._M_head_impl = &((BiOpExpr *)0x0)->super_Expr;
    if (*(_func_int ***)_Var1.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl ==
        (_func_int **)&PTR__UnOpExpr_0012b9c0) {
      _Var3._M_head_impl = (Expr *)_Var1.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    }
    tVar4 = optimizeUnOpExpr((UnOpExpr *)this,(size_t *)_Var3._M_head_impl);
    reducedexpressions =
         (size_t *)
         tVar4.
         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
         .
         super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
         ._M_head_impl._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    goto LAB_0010e60b;
  case EXPR_BODY:
    puVar2 = &BodyExpr::vtable;
    break;
  case EXPR_ARRLIT:
    puVar2 = &ArrayLitExpr::vtable;
    break;
  case EXPR_ARRCPY:
    puVar2 = &ArrayCpyExpr::vtable;
    break;
  case EXPR_ARREMPTY:
    puVar2 = &ArrayEmptyExpr::vtable;
  }
  reducedexpressions =
       (size_t *)(_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)0x0;
  if (*(_func_int ***)_Var1.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl ==
      (_func_int **)(puVar2 + 0x10)) {
    reducedexpressions = (size_t *)_Var1.super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  }
  *this = (pfederc)0x0;
  *(size_t **)(this + 8) = reducedexpressions;
LAB_0010e60b:
  tVar4.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>.
  _M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)reducedexpressions;
  tVar4.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  _0_8_ = this;
  return (tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>)
         tVar4.
         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
  ;
}

Assistant:

std::tuple<std::unique_ptr<Expr>, bool /* changed */> pfederc::optimize(
    std::unique_ptr<Expr> &&expr, size_t &reducedexpressions) noexcept {
  Expr *pexpr = expr.release();
  switch (pexpr->getType()) {
  case ExprType::EXPR_PROG:
    return optimizeProgramExpr(dynamic_cast<ProgramExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_FUNC:
    return optimizeFuncExpr(dynamic_cast<FuncExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_LAMBDA:
    return optimizeLambdaExpr(dynamic_cast<LambdaExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_CLASS:
    return optimizeClassExpr(dynamic_cast<ClassExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_TRAITIMPL:
    return optimizeTraitImplExpr(dynamic_cast<TraitImplExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_MOD:
    return optimizeModExpr(dynamic_cast<ModExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_SAFE:
    return optimizeSafeExpr(dynamic_cast<SafeExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_IF:
    return optimizeIfExpr(dynamic_cast<IfExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_LOOP_FOR:
  case ExprType::EXPR_LOOP_DO:
    return optimizeLoopExpr(dynamic_cast<LoopExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_MATCH:
    return optimizeMatchExpr(dynamic_cast<MatchExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_BIOP:
    return optimizeBiOpExpr(dynamic_cast<BiOpExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_UNOP:
    return optimizeUnOpExpr(dynamic_cast<UnOpExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_BODY:
    return optimizeBodyExpr(dynamic_cast<BodyExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_ARRCPY:
    return optimizeArrayCpyExpr(dynamic_cast<ArrayCpyExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_ARRLIT:
    return optimizeArrayLitExpr(dynamic_cast<ArrayLitExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_ARREMPTY:
    return optimizeArrayEmptyExpr(dynamic_cast<ArrayEmptyExpr*>(pexpr), reducedexpressions);
  default:
    return std::tuple<std::unique_ptr<Expr>, bool>(
        std::unique_ptr<Expr>(pexpr), false);
  }
}